

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toeplitz_plus_hankel_system_solver.cc
# Opt level: O2

bool __thiscall
sptk::ToeplitzPlusHankelSystemSolver::Run
          (ToeplitzPlusHankelSystemSolver *this,
          vector<double,_std::allocator<double>_> *toeplitz_coefficient_vector,
          vector<double,_std::allocator<double>_> *hankel_coefficient_vector,
          vector<double,_std::allocator<double>_> *constant_vector,
          vector<double,_std::allocator<double>_> *solution_vector,Buffer *buffer)

{
  Matrix2D *inverse_matrix;
  Matrix2D *this_00;
  Matrix2D *this_01;
  Matrix2D *output;
  vector<double,_std::allocator<double>_> *column_vector;
  Matrix2D *transposed_matrix;
  Matrix2D *output_00;
  vector<double,_std::allocator<double>_> *output_01;
  vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *this_02;
  vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *this_03;
  vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *this_04;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_05;
  double dVar1;
  int iVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pMVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  size_type __new_size;
  long lVar15;
  long lVar16;
  int i;
  long lVar17;
  long local_70;
  long local_58;
  
  if (this->is_valid_ != true) {
    return false;
  }
  iVar2 = this->num_order_;
  lVar17 = (long)iVar2;
  lVar11 = (long)(toeplitz_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(toeplitz_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  if ((lVar11 >> 3 == (lVar17 + 1) * 2 + -1) &&
     ((long)(hankel_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(hankel_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl
            .super__Vector_impl_data._M_start == lVar11)) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (solution_vector == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    lVar11 = (long)(constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    __new_size = lVar11 >> 3;
    if (__new_size != (long)(int)(lVar17 + 1)) {
      return false;
    }
    if ((long)(solution_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(solution_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar11) {
      std::vector<double,_std::allocator<double>_>::resize(solution_vector,__new_size);
    }
    this_02 = &buffer->r_;
    if (((long)(buffer->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x28 != __new_size) {
      std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize(this_02,__new_size);
    }
    this_03 = &buffer->x_;
    if (((long)(buffer->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x28 != __new_size) {
      std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize(this_03,__new_size);
    }
    this_04 = &buffer->prev_x_;
    if (((long)(buffer->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x28 != __new_size) {
      std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize(this_04,__new_size);
    }
    this_05 = &buffer->p_;
    if (((long)(buffer->p_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->p_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 != __new_size) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_05,__new_size);
      lVar11 = 0;
      for (lVar12 = 0; lVar12 <= lVar17; lVar12 = lVar12 + 1) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((this_05->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar11),2);
        lVar11 = lVar11 + 0x18;
      }
    }
    pdVar4 = (toeplitz_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)this->num_order_;
    pdVar5 = (hankel_coefficient_vector->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar11 = 4;
    lVar15 = 0;
    for (lVar16 = 0; lVar16 <= lVar17; lVar16 = lVar16 + 1) {
      pMVar6 = (this_02->super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(double *)((long)pMVar6 + lVar11 * 8 + -0x18) = pdVar4[lVar12 + lVar16];
      (&pMVar6->_vptr_Matrix2D)[lVar11] = *(_func_int ***)((long)pdVar4 + lVar15 + lVar12 * 8);
      *(double *)((long)pMVar6 + lVar11 * 8 + -0x10) = pdVar5[lVar12 + lVar16];
      *(undefined8 *)((long)pMVar6 + lVar11 * 8 + -8) =
           *(undefined8 *)((long)pdVar5 + lVar15 + lVar12 * 8);
      lVar11 = lVar11 + 5;
      lVar15 = lVar15 + -8;
    }
    if (this->coefficients_modification_ != false) {
      uVar3 = this->num_order_;
      dVar1 = pdVar4[(int)uVar3];
      lVar11 = 0x20;
      for (lVar12 = 0; lVar12 <= lVar17; lVar12 = lVar12 + 2) {
        pMVar6 = (this_02->super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)pMVar6 + lVar11 + -0x18) =
             *(double *)((long)pMVar6 + lVar11 + -0x18) + dVar1;
        *(double *)((long)&pMVar6->_vptr_Matrix2D + lVar11) =
             *(double *)((long)&pMVar6->_vptr_Matrix2D + lVar11) + dVar1;
        lVar11 = lVar11 + 0x50;
      }
      uVar13 = (ulong)(uVar3 & 1);
      lVar11 = uVar13 * 0x28 + 0x10;
      for (; (long)uVar13 <= lVar17; uVar13 = uVar13 + 2) {
        pMVar6 = (this_02->super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar7 = (double *)((long)&pMVar6->_vptr_Matrix2D + lVar11);
        dVar9 = pdVar7[1];
        pdVar8 = (double *)((long)&pMVar6->_vptr_Matrix2D + lVar11);
        *pdVar8 = *pdVar7 - dVar1;
        pdVar8[1] = dVar9 - dVar1;
        lVar11 = lVar11 + 0x50;
      }
    }
    Matrix2D::FillDiagonal
              ((buffer->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
               _M_impl.super__Vector_impl_data._M_start,1.0);
    pdVar7 = (buffer->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar7 = *(constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    pdVar7[1] = (constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish[-1];
    inverse_matrix = &buffer->inv_;
    bVar10 = Matrix2D::Invert((buffer->r_).
                              super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>.
                              _M_impl.super__Vector_impl_data._M_start,inverse_matrix);
    if (bVar10) {
      bVar10 = Matrix2D::Multiply(inverse_matrix,&buffer->bar_,
                                  (this_05->
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
      if (!bVar10) {
        return false;
      }
      this_00 = &buffer->vx_;
      Matrix2D::operator=(this_00,(buffer->r_).
                                  super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      this_01 = &buffer->ex_;
      output = &buffer->tmp_matrix_;
      column_vector = &buffer->tmp_vector_;
      transposed_matrix = &buffer->tau_;
      output_00 = &buffer->bx_;
      output_01 = &buffer->g_;
      iVar14 = 0;
      if (0 < iVar2) {
        iVar14 = iVar2;
      }
      uVar13 = 1;
      local_58 = 0;
      local_70 = 0;
      lVar11 = 0x28;
      while( true ) {
        if (uVar13 == iVar14 + 1) {
          pdVar4 = (solution_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = 0;
          for (lVar12 = 0; lVar12 <= lVar17; lVar12 = lVar12 + 1) {
            pdVar4[lVar12] =
                 **(double **)
                   ((long)&(((this_05->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar11);
            lVar11 = lVar11 + 0x18;
          }
          return true;
        }
        Matrix2D::Fill(this_01,0.0);
        lVar15 = 0;
        lVar12 = lVar11;
        while (lVar12 + -0x28 != -0x28) {
          bVar10 = Matrix2D::Multiply((Matrix2D *)
                                      ((long)&((this_02->
                                               super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                              _vptr_Matrix2D + lVar12),
                                      (Matrix2D *)
                                      ((long)&((this_03->
                                               super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                              _vptr_Matrix2D + lVar15),output);
          if (!bVar10) {
            return false;
          }
          lVar15 = lVar15 + 0x28;
          bVar10 = Matrix2D::Add(output,this_01);
          lVar12 = lVar12 + -0x28;
          if (!bVar10) {
            return false;
          }
        }
        pdVar4 = (buffer->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar4 = 0.0;
        pdVar4[1] = 0.0;
        lVar15 = 0;
        for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -0x28) {
          bVar10 = Matrix2D::Multiply((Matrix2D *)
                                      ((long)&((this_02->
                                               super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                              _vptr_Matrix2D + lVar12),
                                      (vector<double,_std::allocator<double>_> *)
                                      ((long)&(((this_05->
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data + lVar15),
                                      column_vector);
          if (!bVar10) {
            return false;
          }
          pdVar7 = (buffer->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (buffer->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          *pdVar7 = *pdVar8 + *pdVar7;
          pdVar7[1] = pdVar8[1] + pdVar7[1];
          lVar15 = lVar15 + 0x18;
        }
        bVar10 = Matrix2D::CrossTranspose(this_00,transposed_matrix);
        if (((!bVar10) || (bVar10 = Matrix2D::Invert(transposed_matrix,inverse_matrix), !bVar10)) ||
           (bVar10 = Matrix2D::Multiply(inverse_matrix,this_01,output_00), !bVar10)) break;
        lVar12 = 0x28;
        lVar15 = local_70;
        while (lVar15 + -0x28 != -0x28) {
          bVar10 = Matrix2D::CrossTranspose
                             ((Matrix2D *)
                              ((long)&((this_04->
                                       super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_vptr_Matrix2D +
                              lVar15),transposed_matrix);
          if (!bVar10) {
            return false;
          }
          bVar10 = Matrix2D::Multiply(transposed_matrix,output_00,output);
          if (!bVar10) {
            return false;
          }
          bVar10 = Matrix2D::Subtract(output,(Matrix2D *)
                                             ((long)&((this_03->
                                                                                                            
                                                  super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  _vptr_Matrix2D + lVar12));
          lVar12 = lVar12 + 0x28;
          lVar15 = lVar15 + -0x28;
          if (!bVar10) {
            return false;
          }
        }
        Matrix2D::Negate((this_03->
                         super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar13,output_00);
        for (lVar12 = 0x28; local_58 + lVar12 != 0x50; lVar12 = lVar12 + 0x28) {
          Matrix2D::operator=((Matrix2D *)
                              ((long)&((this_04->
                                       super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_vptr_Matrix2D +
                              lVar12),(Matrix2D *)
                                      ((long)&((this_03->
                                               super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                              _vptr_Matrix2D + lVar12));
        }
        bVar10 = Matrix2D::CrossTranspose(this_01,transposed_matrix);
        if (!bVar10) {
          return false;
        }
        bVar10 = Matrix2D::Multiply(transposed_matrix,output_00,output);
        if (!bVar10) {
          return false;
        }
        bVar10 = Matrix2D::Subtract(output,this_00);
        if (!bVar10) {
          return false;
        }
        bVar10 = Matrix2D::CrossTranspose(this_00,transposed_matrix);
        if (!bVar10) {
          return false;
        }
        bVar10 = Matrix2D::Invert(transposed_matrix,inverse_matrix);
        if (!bVar10) {
          return false;
        }
        dVar1 = (constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar13];
        pdVar7 = (buffer->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar7 = dVar1;
        pdVar7[1] = (constant_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish[~uVar13];
        pdVar8 = (buffer->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (buffer->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar4 = dVar1 - *pdVar8;
        pdVar4[1] = pdVar7[1] - pdVar8[1];
        bVar10 = Matrix2D::Multiply(inverse_matrix,column_vector,output_01);
        if (!bVar10) {
          return false;
        }
        lVar15 = 0;
        for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -0x28) {
          bVar10 = Matrix2D::CrossTranspose
                             ((Matrix2D *)
                              ((long)&((this_03->
                                       super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_vptr_Matrix2D +
                              lVar12),transposed_matrix);
          if (!bVar10) {
            return false;
          }
          bVar10 = Matrix2D::Multiply(transposed_matrix,output_01,column_vector);
          if (!bVar10) {
            return false;
          }
          pdVar7 = (column_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = *(double **)
                    ((long)&(((this_05->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar15);
          *pdVar8 = *pdVar7 + *pdVar8;
          pdVar8[1] = pdVar7[1] + pdVar8[1];
          lVar15 = lVar15 + 0x18;
        }
        std::vector<double,_std::allocator<double>_>::operator=
                  ((this_05->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar13,output_01);
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 0x28;
        local_70 = local_70 + 0x28;
        local_58 = local_58 + -0x28;
      }
    }
  }
  return false;
}

Assistant:

bool ToeplitzPlusHankelSystemSolver::Run(
    const std::vector<double>& toeplitz_coefficient_vector,
    const std::vector<double>& hankel_coefficient_vector,
    const std::vector<double>& constant_vector,
    std::vector<double>* solution_vector,
    ToeplitzPlusHankelSystemSolver::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      toeplitz_coefficient_vector.size() !=
          static_cast<std::size_t>(2 * length - 1) ||
      hankel_coefficient_vector.size() !=
          static_cast<std::size_t>(2 * length - 1) ||
      constant_vector.size() != static_cast<std::size_t>(length) ||
      NULL == solution_vector || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (solution_vector->size() != static_cast<std::size_t>(length)) {
    solution_vector->resize(length);
  }
  if (buffer->r_.size() != static_cast<std::size_t>(length)) {
    buffer->r_.resize(length);
  }
  if (buffer->x_.size() != static_cast<std::size_t>(length)) {
    buffer->x_.resize(length);
  }
  if (buffer->prev_x_.size() != static_cast<std::size_t>(length)) {
    buffer->prev_x_.resize(length);
  }
  if (buffer->p_.size() != static_cast<std::size_t>(length)) {
    buffer->p_.resize(length);
    for (int i(0); i < length; ++i) {
      buffer->p_[i].resize(2);
    }
  }

  // Step 0)
  {
    // Set R.
    const double* t(&(toeplitz_coefficient_vector[0]));
    const double* h(&(hankel_coefficient_vector[0]));
    for (int i(0); i < length; ++i) {
      buffer->r_[i][0][0] = t[num_order_ + i];
      buffer->r_[i][1][1] = t[num_order_ - i];
      buffer->r_[i][0][1] = h[num_order_ + i];
      buffer->r_[i][1][0] = h[num_order_ - i];
    }

    if (coefficients_modification_) {
      const double d0(t[num_order_]);
      for (int i(0); i < length; i += 2) {
        buffer->r_[i][0][0] += d0;
        buffer->r_[i][1][1] += d0;
      }
      for (int i((0 == num_order_ % 2) ? 0 : 1); i < length; i += 2) {
        buffer->r_[i][0][1] -= d0;
        buffer->r_[i][1][0] -= d0;
      }
    }
  }

  // Step 1)
  {
    // Set X_0.
    buffer->x_[0].FillDiagonal(1.0);

    // Set p_0.
    PutBar(0, constant_vector, &buffer->bar_);
    if (!buffer->r_[0].Invert(&buffer->inv_) ||
        !sptk::Matrix2D::Multiply(buffer->inv_, buffer->bar_, &buffer->p_[0])) {
      return false;
    }

    // Set V_x.
    buffer->vx_ = buffer->r_[0];
  }

  // Step 2)
  for (int i(1); i < length; ++i) {
    // a) Calculate E_x.
    buffer->ex_.Fill(0.0);
    for (int j(0); j < i; ++j) {
      if (!sptk::Matrix2D::Multiply(buffer->r_[i - j], buffer->x_[j],
                                    &buffer->tmp_matrix_) ||
          !sptk::Matrix2D::Add(buffer->tmp_matrix_, &buffer->ex_)) {
        return false;
      }
    }

    // b) Calculate \bar{e}_p.
    buffer->ep_[0] = 0.0;
    buffer->ep_[1] = 0.0;
    for (int j(0); j < i; ++j) {
      if (!sptk::Matrix2D::Multiply(buffer->r_[i - j], buffer->p_[j],
                                    &buffer->tmp_vector_)) {
        return false;
      }
      buffer->ep_[0] += buffer->tmp_vector_[0];
      buffer->ep_[1] += buffer->tmp_vector_[1];
    }

    // c) Calculate B_x.
    if (!buffer->vx_.CrossTranspose(&buffer->tau_) ||
        !buffer->tau_.Invert(&buffer->inv_) ||
        !sptk::Matrix2D::Multiply(buffer->inv_, buffer->ex_, &buffer->bx_)) {
      return false;
    }

    // d) Update X.
    for (int j(1); j < i; ++j) {
      if (!buffer->prev_x_[i - j].CrossTranspose(&buffer->tau_) ||
          !sptk::Matrix2D::Multiply(buffer->tau_, buffer->bx_,
                                    &buffer->tmp_matrix_) ||
          !sptk::Matrix2D::Subtract(buffer->tmp_matrix_, &buffer->x_[j])) {
        return false;
      }
    }
    buffer->x_[i].Negate(buffer->bx_);
    for (int j(1); j <= i; ++j) {
      buffer->prev_x_[j] = buffer->x_[j];
    }

    // d) Update V_x.
    if (!buffer->ex_.CrossTranspose(&buffer->tau_) ||
        !sptk::Matrix2D::Multiply(buffer->tau_, buffer->bx_,
                                  &buffer->tmp_matrix_) ||
        !sptk::Matrix2D::Subtract(buffer->tmp_matrix_, &buffer->vx_)) {
      return false;
    }

    // e) Calculate \bar{g}.
    if (!buffer->vx_.CrossTranspose(&buffer->tau_) ||
        !buffer->tau_.Invert(&buffer->inv_)) {
      return false;
    }
    PutBar(i, constant_vector, &buffer->bar_);
    buffer->tmp_vector_[0] = buffer->bar_[0] - buffer->ep_[0];
    buffer->tmp_vector_[1] = buffer->bar_[1] - buffer->ep_[1];
    if (!sptk::Matrix2D::Multiply(buffer->inv_, buffer->tmp_vector_,
                                  &buffer->g_)) {
      return false;
    }

    // f) Update \bar{p}.
    for (int j(0); j < i; ++j) {
      if (!buffer->x_[i - j].CrossTranspose(&buffer->tau_) ||
          !sptk::Matrix2D::Multiply(buffer->tau_, buffer->g_,
                                    &buffer->tmp_vector_)) {
        return false;
      }
      buffer->p_[j][0] += buffer->tmp_vector_[0];
      buffer->p_[j][1] += buffer->tmp_vector_[1];
    }
    buffer->p_[i] = buffer->g_;
  }

  // Step 3)
  {
    double* a(&((*solution_vector)[0]));
    for (int i(0); i < length; ++i) {
      a[i] = buffer->p_[i][0];
    }
  }

  return true;
}